

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::NewScObjectNoCtor(Var instance,ScriptContext *requestContext)

{
  bool bVar1;
  undefined8 local_20;
  ScriptContext *requestContext_local;
  Var instance_local;
  
  bVar1 = VarIs<Js::JavascriptProxy>(instance);
  if (bVar1) {
    local_20 = (Var)0x0;
  }
  else {
    local_20 = NewScObjectNoCtorCommon(instance,requestContext,false);
  }
  return local_20;
}

Assistant:

Var JavascriptOperators::NewScObjectNoCtor(Var instance, ScriptContext * requestContext)
    {
        // This helper can be reentrant because although we don't call the Constructor, we might have to parse it if bytecode is missing
        // In which case, we would leave script. When we leave script we DisposeObjects which can dispose of Edge objects that could
        // have a javascript onDispose handler and call that handler.
        JIT_HELPER_REENTRANT_HEADER(NewScObjectNoCtor);
        // We can still call into NewScObjectNoCtor variations in JIT code for performance; however for proxy we don't
        // really need the new object as the trap will handle the "this" pointer separately. pass back nullptr to ensure
        // failure in invalid case.
        return (VarIs<JavascriptProxy>(instance)) ? nullptr : NewScObjectNoCtorCommon(instance, requestContext, false);
        JIT_HELPER_END(NewScObjectNoCtor);
    }